

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec2.c
# Opt level: O0

bool_t ec2CreateLD(ec_o *ec,qr_o *f,octet *A,octet *B,void *stack)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  undefined8 in_RCX;
  undefined8 in_RDX;
  long in_RSI;
  long *in_RDI;
  undefined8 in_R8;
  size_t in_stack_ffffffffffffff78;
  void *in_stack_ffffffffffffff80;
  size_t in_stack_ffffffffffffff88;
  size_t in_stack_ffffffffffffff90;
  
  memSet(in_stack_ffffffffffffff80,(octet)(in_stack_ffffffffffffff78 >> 0x38),0x17ee51);
  in_RDI[9] = 3;
  in_RDI[3] = in_RSI;
  in_RDI[4] = (long)(in_RDI + 0x16);
  in_RDI[5] = in_RDI[4] + *(long *)(in_RSI + 0x30) * 8;
  iVar1 = (**(code **)(in_RDI[3] + 0x40))(in_RDI[4],in_RDX,in_RDI[3],in_R8);
  if ((iVar1 != 0) &&
     (iVar1 = (**(code **)(in_RDI[3] + 0x40))(in_RDI[5],in_RCX,in_RDI[3],in_R8), iVar1 != 0)) {
    in_RDI[6] = in_RDI[5] + *(long *)(in_RSI + 0x30) * 8;
    in_RDI[7] = in_RDI[6] + *(long *)(in_RSI + 0x30) * 0x10;
    in_RDI[0xb] = (long)ec2FromALD;
    in_RDI[0xc] = (long)ec2ToALD;
    in_RDI[0xd] = (long)ec2NegLD;
    in_RDI[0xe] = (long)ec2AddLD;
    in_RDI[0xf] = (long)ec2AddALD;
    in_RDI[0x10] = (long)ec2SubLD;
    in_RDI[0x11] = (long)ec2SubALD;
    in_RDI[0x12] = (long)ec2DblLD;
    in_RDI[0x13] = (long)ec2DblALD;
    sVar2 = ec2ToALD_deep(*(size_t *)(in_RSI + 0x30),*(size_t *)(in_RSI + 0x88));
    sVar3 = ec2NegLD_deep(*(size_t *)(in_RSI + 0x30),*(size_t *)(in_RSI + 0x88));
    sVar4 = ec2AddLD_deep(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    sVar5 = ec2AddALD_deep(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    sVar6 = ec2SubLD_deep(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    sVar7 = ec2SubALD_deep((size_t)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    sVar8 = ec2DblLD_deep(*(size_t *)(in_RSI + 0x30),*(size_t *)(in_RSI + 0x88));
    sVar9 = ec2DblALD_deep(*(size_t *)(in_RSI + 0x30),*(size_t *)(in_RSI + 0x88));
    sVar2 = utilMax(8,sVar2,sVar3,sVar4,sVar5,sVar6,sVar7,sVar8,sVar9);
    in_RDI[0x15] = sVar2;
    *in_RDI = (*(long *)(in_RSI + 0x30) * 5 + 1) * 8 + 0xb0;
    in_RDI[1] = 6;
    in_RDI[2] = 1;
    return 1;
  }
  return 0;
}

Assistant:

bool_t ec2CreateLD(ec_o* ec, const qr_o* f, const octet A[], const octet B[],
	void* stack)
{
	ASSERT(memIsValid(ec, sizeof(ec_o)));
	ASSERT(gf2IsOperable(f));
	ASSERT(memIsValid(A, f->no));
	ASSERT(memIsValid(B, f->no));
	// обнулить
	memSetZero(ec, sizeof(ec_o));
	// зафикисровать размерности
	ec->d = 3;
	// запомнить базовое поле
	ec->f = f;
	// сохранить коэффициенты
	ec->A = (word*)ec->descr;
	ec->B = ec->A + f->n;
	if (!qrFrom(ec->A, A, ec->f, stack) || !qrFrom(ec->B, B, ec->f, stack))
		return FALSE;
	// подготовить буферы для описания группы точек
	ec->base = ec->B + f->n;
	ec->order = ec->base + 2 * f->n;
	// настроить интерфейсы
	ec->froma = ec2FromALD;
	ec->toa = ec2ToALD;
	ec->neg = ec2NegLD;
	ec->add = ec2AddLD;
	ec->adda = ec2AddALD;
	ec->sub = ec2SubLD;
	ec->suba = ec2SubALD;
	ec->dbl = ec2DblLD;
	ec->dbla = ec2DblALD;
	ec->deep = utilMax(8,
		ec2ToALD_deep(f->n, f->deep),
		ec2NegLD_deep(f->n, f->deep),
		ec2AddLD_deep(f->n, f->deep),
		ec2AddALD_deep(f->n, f->deep),
		ec2SubLD_deep(f->n, f->deep),
		ec2SubALD_deep(f->n, f->deep),
		ec2DblLD_deep(f->n, f->deep),
		ec2DblALD_deep(f->n, f->deep));
	// настроить заголовок
	ec->hdr.keep = sizeof(ec_o) + O_OF_W(5 * f->n + 1);
	ec->hdr.p_count = 6;
	ec->hdr.o_count = 1;
	// все нормально
	return TRUE;
}